

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TextureBufferTextureBufferRange::iterate(TextureBufferTextureBufferRange *this)

{
  code *pcVar1;
  bool bVar2;
  GLboolean GVar3;
  int iVar4;
  deUint32 dVar5;
  GLenum GVar6;
  GLuint GVar7;
  GLuint GVar8;
  GLenum GVar9;
  RenderContext *pRVar10;
  undefined4 extraout_var;
  pointer ppVar12;
  reference pvVar13;
  TestError *pTVar14;
  char *local_f8;
  char *csCode;
  string csSource;
  GLenum glerr;
  GLint sampler_location;
  char *vsCode;
  char *fsCode;
  string vsSource;
  string fsSource;
  char *varyings [2];
  allocator<unsigned_char> local_51;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  FormatInfo *info;
  _Self local_28;
  iterator it;
  GLuint offset;
  bool testResult;
  Functions *gl;
  TextureBufferTextureBufferRange *this_local;
  long lVar11;
  
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  pRVar10 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar4 = (*pRVar10->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar4);
  it._M_node._7_1_ = 1;
  it._M_node._0_4_ = 0;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_glcts::FormatInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_glcts::FormatInfo>_>_>
       ::begin(&this->m_configurations);
  while( true ) {
    info = (FormatInfo *)
           std::
           map<unsigned_int,_glcts::FormatInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_glcts::FormatInfo>_>_>
           ::end(&this->m_configurations);
    bVar2 = std::operator!=(&local_28,(_Self *)&info);
    if (!bVar2) {
      if ((it._M_node._7_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      return STOP;
    }
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_glcts::FormatInfo>_>::operator->
                        (&local_28);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&ppVar12->second;
    (**(code **)(lVar11 + 0x6f8))(1,&this->m_tbo_tex_id);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error generating texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x36f);
    (**(code **)(lVar11 + 8))(0x84c0);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error setting active texture unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x371);
    (**(code **)(lVar11 + 0xb8))
              ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_tex_id);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error binding texture buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x373);
    pcVar1 = *(code **)(lVar11 + 0x1300);
    GVar9 = (this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER;
    GVar6 = FormatInfo::get_internal_format
                      ((FormatInfo *)
                       buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar4 = (int)it._M_node;
    GVar8 = this->m_tbo_id;
    GVar7 = FormatInfo::get_not_aligned_size
                      ((FormatInfo *)
                       buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    (*pcVar1)(GVar9,GVar6,GVar8,iVar4,GVar7);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error setting buffer object as data store for texture buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x376);
    (**(code **)(lVar11 + 0x6c8))(1,&this->m_tf_size_buffer_id);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error generating buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x37a);
    (**(code **)(lVar11 + 0x40))(0x8892,this->m_tf_size_buffer_id);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error binding buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x37c);
    (**(code **)(lVar11 + 0x150))(0x8892,4,0,0x88ea);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error allocating buffer object\'s data store!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x37e);
    GVar8 = FormatInfo::get_ssbo_value_size
                      ((FormatInfo *)
                       buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<unsigned_char>::allocator(&local_51);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,(ulong)GVar8,
               &local_51);
    std::allocator<unsigned_char>::~allocator(&local_51);
    pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
    GVar8 = FormatInfo::get_ssbo_value_size
                      ((FormatInfo *)
                       buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    memset(pvVar13,0,(ulong)GVar8);
    (**(code **)(lVar11 + 0x6c8))(1,&this->m_tf_value_buffer_id);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error generating buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,900);
    (**(code **)(lVar11 + 0x40))(0x8892,this->m_tf_value_buffer_id);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error binding buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x386);
    pcVar1 = *(code **)(lVar11 + 0x150);
    GVar8 = FormatInfo::get_ssbo_value_size
                      ((FormatInfo *)
                       buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
    (*pcVar1)(0x8892,GVar8,pvVar13,0x88ea);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error allocating buffer object\'s data store!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x388);
    GVar8 = (**(code **)(lVar11 + 0x3c8))();
    this->m_vsfs_po_id = GVar8;
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error creating program object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x38c);
    fsSource.field_2._8_4_ = 0x2af3b44;
    fsSource.field_2._12_4_ = 0;
    (**(code **)(lVar11 + 0x14c8))
              (this->m_vsfs_po_id,2,(undefined1 *)((long)&fsSource.field_2 + 8),0x8c8d);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error setting transform feedback varyings!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x391);
    GVar8 = (**(code **)(lVar11 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar8;
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error creating shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x394);
    GVar8 = (**(code **)(lVar11 + 0x3f0))(0x8b31);
    this->m_vs_id = GVar8;
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error creating shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x397);
    getFragmentShaderCode_abi_cxx11_
              ((string *)((long)&vsSource.field_2 + 8),this,
               (FormatInfo *)
               buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    getVertexShaderCode_abi_cxx11_
              ((string *)&fsCode,this,
               (FormatInfo *)
               buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    vsCode = (char *)std::__cxx11::string::c_str();
    _glerr = (char *)std::__cxx11::string::c_str();
    bVar2 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_vsfs_po_id,this->m_fs_id,1,&vsCode,
                       this->m_vs_id,1,(char **)&glerr,(bool *)0x0);
    if (!bVar2) break;
    (**(code **)(lVar11 + 0x1680))(this->m_vsfs_po_id);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error setting active program object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3a4);
    csSource.field_2._12_4_ = (**(code **)(lVar11 + 0xb48))(this->m_vsfs_po_id,"sampler_buffer");
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error getting uniform location!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3a7);
    if (csSource.field_2._12_4_ == -1) {
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar14,"Failed to get uniform location for valid uniform variable",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                 ,0x3aa);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(lVar11 + 0x14f0))(csSource.field_2._12_4_,0);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error setting value for uniform location!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3ae);
    (**(code **)(lVar11 + 0x48))(0x8c8e,0,this->m_tf_size_buffer_id);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error binding buffer object to transform feedback binding point.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3b2);
    (**(code **)(lVar11 + 0x48))(0x8c8e,1,this->m_tf_value_buffer_id);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error binding buffer object to transform feedback binding point.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3b4);
    (**(code **)(lVar11 + 0x30))(0);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error beginning transform feedback.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3b7);
    (**(code **)(lVar11 + 0x538))(0,0,1);
    csSource.field_2._8_4_ = (**(code **)(lVar11 + 0x800))();
    (**(code **)(lVar11 + 0x638))();
    glu::checkError(csSource.field_2._8_4_,"Error drawing arrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3be);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error ending transform feedback.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3bf);
    (**(code **)(lVar11 + 0xdb8))(0x200);
    dVar5 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar5,"Error setting memory barrier.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3c2);
    bVar2 = checkResult(this,(FormatInfo *)
                             buffer.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                        "Vertex/Fragment shader",true);
    if (!bVar2) {
      it._M_node._7_1_ = 0;
    }
    GVar3 = FormatInfo::get_is_image_supported
                      ((FormatInfo *)
                       buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (GVar3 != '\0') {
      (**(code **)(lVar11 + 0x6c8))(1,&this->m_ssbo_size_id);
      dVar5 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar5,"Error generating buffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3cf);
      (**(code **)(lVar11 + 0x40))(0x8892,this->m_ssbo_size_id);
      dVar5 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar5,"Error binding  buffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3d1);
      (**(code **)(lVar11 + 0x150))(0x8892,4,0,0x88ea);
      dVar5 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar5,"Error allocating buffer object\'s data store!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3d3);
      (**(code **)(lVar11 + 0x6c8))(1,&this->m_ssbo_value_id);
      dVar5 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar5,"Error generating buffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3d6);
      (**(code **)(lVar11 + 0x40))(0x8892,this->m_ssbo_value_id);
      dVar5 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar5,"Error binding  buffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3d8);
      pcVar1 = *(code **)(lVar11 + 0x150);
      GVar8 = FormatInfo::get_ssbo_value_size
                        ((FormatInfo *)
                         buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
      (*pcVar1)(0x8892,GVar8,pvVar13,0x88ea);
      dVar5 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar5,"Error allocating buffer object\'s data store!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3da);
      GVar8 = (**(code **)(lVar11 + 0x3c8))();
      this->m_cs_po_id = GVar8;
      dVar5 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar5,"Error creating program object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3de);
      GVar8 = (**(code **)(lVar11 + 0x3f0))(0x91b9);
      this->m_cs_id = GVar8;
      dVar5 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar5,"Error creating shader object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3e1);
      getComputeShaderCode_abi_cxx11_
                ((string *)&csCode,this,
                 (FormatInfo *)
                 buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      local_f8 = (char *)std::__cxx11::string::c_str();
      bVar2 = TestCaseBase::buildProgram
                        (&this->super_TestCaseBase,this->m_cs_po_id,this->m_cs_id,1,&local_f8,
                         (bool *)0x0);
      if (!bVar2) {
        pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar14,"Could not build program from valid compute shader code!",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                   ,1000);
        __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(lVar11 + 0x1680))(this->m_cs_po_id);
      dVar5 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar5,"Error setting active program object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3ec);
      (**(code **)(lVar11 + 0x48))(0x90d2,0,this->m_ssbo_size_id);
      dVar5 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar5,"Error binding buffer object to shader storage binding point!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3f0);
      (**(code **)(lVar11 + 0x48))(0x90d2,1,this->m_ssbo_value_id);
      dVar5 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar5,"Error binding buffer object to shader storage binding point!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3f2);
      pcVar1 = *(code **)(lVar11 + 0x80);
      GVar8 = this->m_tbo_tex_id;
      GVar9 = FormatInfo::get_internal_format
                        ((FormatInfo *)
                         buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      (*pcVar1)(0,GVar8,0,0,0,35000,GVar9);
      dVar5 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar5,"Error binding texture object to image unit 0!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3f6);
      (**(code **)(lVar11 + 0x528))(1,1);
      dVar5 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar5,"Error running compute shader!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3fa);
      (**(code **)(lVar11 + 0xdb8))(0x200);
      dVar5 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar5,"Error setting memory barrier!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3fd);
      bVar2 = checkResult(this,(FormatInfo *)
                               buffer.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,"Compute shader",
                          false);
      if (!bVar2) {
        it._M_node._7_1_ = 0;
      }
      std::__cxx11::string::~string((string *)&csCode);
    }
    GVar8 = FormatInfo::get_aligned_size
                      ((FormatInfo *)
                       buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    it._M_node._0_4_ = (int)it._M_node + GVar8;
    cleanIteration(this);
    std::__cxx11::string::~string((string *)&fsCode);
    std::__cxx11::string::~string((string *)(vsSource.field_2._M_local_buf + 8));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_glcts::FormatInfo>_>::operator++(&local_28)
    ;
  }
  pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar14,"Could not build program from valid vertex/fragment shader code!",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
             ,0x3a0);
  __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult TextureBufferTextureBufferRange::iterate(void)
{
	/* Initialize */
	initTest();

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool		testResult = true;
	glw::GLuint offset	 = 0;

	for (std::map<glw::GLenum, FormatInfo>::iterator it = m_configurations.begin(); it != m_configurations.end(); ++it)
	{
		FormatInfo& info = it->second;

		/* Create texture object */
		gl.genTextures(1, &m_tbo_tex_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");
		gl.activeTexture(GL_TEXTURE0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active texture unit!");
		gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_tbo_tex_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture buffer object!");
		gl.texBufferRange(m_glExtTokens.TEXTURE_BUFFER, info.get_internal_format(), m_tbo_id, offset,
						  info.get_not_aligned_size());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting buffer object as data store for texture buffer!");

		/* Create transform feedback buffer objects */
		gl.genBuffers(1, &m_tf_size_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
		gl.bindBuffer(GL_ARRAY_BUFFER, m_tf_size_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(glw::GLint), DE_NULL, GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

		std::vector<glw::GLubyte> buffer(info.get_ssbo_value_size());
		memset(&buffer[0], 0, info.get_ssbo_value_size());

		gl.genBuffers(1, &m_tf_value_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
		gl.bindBuffer(GL_ARRAY_BUFFER, m_tf_value_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");
		gl.bufferData(GL_ARRAY_BUFFER, info.get_ssbo_value_size(), &buffer[0], GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

		/* Configure program object using Vertex Shader and Fragment Shader */
		m_vsfs_po_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

		const char* varyings[] = { "outTextureSize", "outValue" };

		gl.transformFeedbackVaryings(m_vsfs_po_id, 2, varyings, GL_SEPARATE_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting transform feedback varyings!");

		m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

		m_vs_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

		std::string fsSource = getFragmentShaderCode(info);
		std::string vsSource = getVertexShaderCode(info);
		const char* fsCode   = fsSource.c_str();
		const char* vsCode   = vsSource.c_str();

		if (!buildProgram(m_vsfs_po_id, m_fs_id, 1, &fsCode, m_vs_id, 1, &vsCode))
		{
			TCU_FAIL("Could not build program from valid vertex/fragment shader code!");
		}

		gl.useProgram(m_vsfs_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

		glw::GLint sampler_location = gl.getUniformLocation(m_vsfs_po_id, "sampler_buffer");
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting uniform location!");
		if (sampler_location == -1)
		{
			TCU_FAIL("Failed to get uniform location for valid uniform variable");
		}

		gl.uniform1i(sampler_location, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for uniform location!");

		/* Configure transform feedback */
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_tf_size_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object to transform feedback binding point.");
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1, m_tf_value_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object to transform feedback binding point.");

		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error beginning transform feedback.");

		/* Render */
		gl.drawArrays(GL_POINTS, 0, 1);
		glw::GLenum glerr = gl.getError();

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(glerr, "Error drawing arrays");
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error ending transform feedback.");

		gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting memory barrier.");

		/* Check results */
		if (!checkResult(info, "Vertex/Fragment shader", true))
		{
			testResult = false;
		}

		/* Run compute shader if internal format is supported by image_load_store */
		if (info.get_is_image_supported())
		{
			/* Create Shader Storage Buffer Object */
			gl.genBuffers(1, &m_ssbo_size_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
			gl.bindBuffer(GL_ARRAY_BUFFER, m_ssbo_size_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding  buffer object!");
			gl.bufferData(GL_ARRAY_BUFFER, sizeof(glw::GLint), 0, GL_DYNAMIC_COPY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

			gl.genBuffers(1, &m_ssbo_value_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
			gl.bindBuffer(GL_ARRAY_BUFFER, m_ssbo_value_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding  buffer object!");
			gl.bufferData(GL_ARRAY_BUFFER, info.get_ssbo_value_size(), &buffer[0], GL_DYNAMIC_COPY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

			/* Create compute shader program */
			m_cs_po_id = gl.createProgram();
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

			m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

			std::string csSource = getComputeShaderCode(info);
			const char* csCode   = csSource.c_str();

			if (!buildProgram(m_cs_po_id, m_cs_id, 1, &csCode))
			{
				TCU_FAIL("Could not build program from valid compute shader code!");
			}

			gl.useProgram(m_cs_po_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

			/* Configure SSBO objects */
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_ssbo_size_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object to shader storage binding point!");
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_ssbo_value_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object to shader storage binding point!");

			/* Bind texture to image unit*/
			gl.bindImageTexture(0, m_tbo_tex_id, 0, GL_FALSE, 0, GL_READ_ONLY, info.get_internal_format());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit 0!");

			/* Run compute shader */
			gl.dispatchCompute(1, 1, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error running compute shader!");

			gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting memory barrier!");

			if (!checkResult(info, "Compute shader", false))
			{
				testResult = false;
			}
		}

		offset += info.get_aligned_size();
		cleanIteration();
	}

	if (testResult)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}